

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

int ImportYUVAFromRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int step,
                      int rgb_stride,float dithering,int use_iterative_conversion,
                      WebPPicture *picture)

{
  fixed_y_t *src;
  short sVar1;
  short sVar2;
  short sVar3;
  int width;
  uint height;
  bool bVar4;
  size_t __n;
  undefined2 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  fixed_y_t *src_00;
  uint16_t *puVar13;
  uint16_t *puVar14;
  fixed_y_t *dst;
  int16_t *ptr;
  int16_t *ptr_00;
  fixed_t *dst_00;
  uint64_t uVar15;
  uint8_t *puVar16;
  int iVar17;
  uint8_t *puVar18;
  uint8_t *b_ptr_00;
  char cVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  uint16_t *puVar23;
  int16_t *piVar24;
  ulong uVar25;
  _func_void_uint8_t_ptr_uint8_t_ptr_int **pp_Var26;
  long lVar27;
  uint8_t *puVar28;
  uint uVar29;
  uint8_t *r_ptr_00;
  uint8_t *puVar30;
  uint uVar31;
  uint8_t uVar32;
  int iVar33;
  int16_t *piVar34;
  int16_t *piVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  int off;
  uint32_t *puVar41;
  uint64_t uVar42;
  uint64_t uVar43;
  uint uVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  size_t sVar48;
  int *piVar49;
  bool bVar50;
  double dVar51;
  undefined1 auVar52 [16];
  uint16_t *local_2b8;
  VP8Random *local_2a8;
  int16_t *local_2a0;
  uint8_t *local_288;
  int16_t *local_250;
  uint8_t *local_1f0;
  int local_1d0;
  ulong local_1a0;
  ulong local_180;
  int16_t *local_178;
  int16_t *local_170;
  VP8Random base_rg;
  
  width = picture->width;
  height = picture->height;
  iVar6 = CheckNonOpaque(a_ptr,width,height,step,rgb_stride);
  picture->colorspace = (uint)(iVar6 != 0) << 2;
  picture->use_argb = 0;
  iVar7 = WebPPictureAllocYUVA(picture,width,height);
  if (iVar7 == 0) {
    return 0;
  }
  if (((use_iterative_conversion == 0) || (width < 4)) || ((int)height < 4)) {
    iVar7 = width + 1 >> 1;
    puVar13 = (uint16_t *)WebPSafeMalloc((long)(iVar7 * 4),2);
    puVar28 = picture->y;
    puVar16 = picture->u;
    puVar18 = picture->v;
    local_288 = picture->a;
    local_2a8 = (VP8Random *)0x0;
    bVar4 = 0.0 < dithering;
    if (bVar4) {
      local_2a8 = &base_rg;
      VP8InitRandom(local_2a8,dithering);
    }
    WebPInitConvertARGBToYUV();
    iVar8 = pthread_mutex_lock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
    if (iVar8 == 0) {
      if (((VP8CPUInfo)InitGammaTables_InitGammaTables_body_last_cpuinfo_used != VP8GetCPUInfo) &&
         (kGammaTablesOk == 0)) {
        puVar14 = kGammaToLinearTab;
        for (lVar45 = 0; lVar45 != 0x100; lVar45 = lVar45 + 1) {
          dVar51 = pow((double)(int)lVar45 * 0.00392156862745098,0.8);
          *puVar14 = (uint16_t)(int)(dVar51 * 4095.0 + 0.5);
          puVar14 = puVar14 + 1;
        }
        piVar49 = kLinearToGammaTab;
        for (lVar45 = 0; lVar45 != 0x21; lVar45 = lVar45 + 1) {
          dVar51 = pow((double)(int)lVar45 * 0.03125763125763126,1.25);
          *piVar49 = (int)(dVar51 * 255.0 + 0.5);
          piVar49 = piVar49 + 1;
        }
        kGammaTablesOk = 1;
      }
      InitGammaTables_InitGammaTables_body_last_cpuinfo_used = VP8GetCPUInfo;
      pthread_mutex_unlock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
    }
    if (puVar13 == (uint16_t *)0x0) {
      return 0;
    }
    iVar8 = (int)height >> 1;
    lVar39 = (long)(rgb_stride * 2);
    lVar45 = 0;
    if (iVar6 != 0) {
      lVar45 = lVar39;
    }
    b_ptr_00 = b_ptr;
    r_ptr_00 = r_ptr;
    local_2b8 = (uint16_t *)g_ptr;
    local_1f0 = a_ptr;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    do {
      bVar50 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      if (bVar50) {
        if ((height & 1) != 0) {
          if (bVar4 || step != 3) {
            ConvertRowToY(r_ptr_00,(uint8_t *)local_2b8,b_ptr_00,step,puVar28,width,local_2a8);
          }
          else {
            if (r_ptr_00 < b_ptr_00) {
              pp_Var26 = &WebPConvertRGB24ToY;
              puVar30 = r_ptr_00;
            }
            else {
              pp_Var26 = &WebPConvertBGR24ToY;
              puVar30 = b_ptr_00;
            }
            (**pp_Var26)(puVar30,puVar28,width);
          }
          if ((iVar6 == 0) ||
             (iVar6 = (*WebPExtractAlpha)(local_1f0,0,width,1,local_288,0), iVar6 != 0)) {
            AccumulateRGB(r_ptr_00,(uint8_t *)local_2b8,b_ptr_00,step,0,puVar13,width);
          }
          else {
            AccumulateRGBA(r_ptr_00,(uint8_t *)local_2b8,b_ptr_00,local_1f0,0,puVar13,width);
          }
          if (local_2a8 == (VP8Random *)0x0) {
            (*WebPConvertRGBA32ToUV)(puVar13,puVar16,puVar18,iVar7);
          }
          else {
            ConvertRowsToUV(puVar13,puVar16,puVar18,iVar7,local_2a8);
          }
        }
        WebPSafeFree(puVar13);
        return 1;
      }
      if (bVar4 || step != 3) {
        ConvertRowToY(r_ptr_00,(uint8_t *)local_2b8,b_ptr_00,step,puVar28,width,local_2a8);
        ConvertRowToY(r_ptr_00 + rgb_stride,(uint8_t *)((long)local_2b8 + (long)rgb_stride),
                      b_ptr_00 + rgb_stride,step,puVar28 + picture->y_stride,width,local_2a8);
      }
      else {
        if (r_ptr < b_ptr) {
          pp_Var26 = &WebPConvertRGB24ToY;
          puVar30 = r_ptr_00;
        }
        else {
          pp_Var26 = &WebPConvertBGR24ToY;
          puVar30 = b_ptr_00;
        }
        (**pp_Var26)(puVar30,puVar28,width);
        (**pp_Var26)(puVar30 + rgb_stride,puVar28 + picture->y_stride,width);
      }
      iVar33 = picture->y_stride;
      if (iVar6 == 0) {
LAB_00123776:
        AccumulateRGB(r_ptr_00,(uint8_t *)local_2b8,b_ptr_00,step,rgb_stride,puVar13,width);
      }
      else {
        iVar37 = (*WebPExtractAlpha)(local_1f0,rgb_stride,width,2,local_288,picture->a_stride);
        local_288 = local_288 + (long)picture->a_stride * 2;
        if (iVar37 != 0) goto LAB_00123776;
        AccumulateRGBA(r_ptr_00,(uint8_t *)local_2b8,b_ptr_00,local_1f0,rgb_stride,puVar13,width);
      }
      if (local_2a8 == (VP8Random *)0x0) {
        (*WebPConvertRGBA32ToUV)(puVar13,puVar16,puVar18,iVar7);
      }
      else {
        ConvertRowsToUV(puVar13,puVar16,puVar18,iVar7,local_2a8);
      }
      puVar28 = puVar28 + (long)iVar33 * 2;
      puVar16 = puVar16 + picture->uv_stride;
      puVar18 = puVar18 + picture->uv_stride;
      local_2b8 = (uint16_t *)((long)local_2b8 + lVar39);
      local_1f0 = local_1f0 + lVar45;
      b_ptr_00 = b_ptr_00 + lVar39;
      r_ptr_00 = r_ptr_00 + lVar39;
    } while( true );
  }
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)InitGammaTablesS_InitGammaTablesS_body_lock);
  if (iVar7 == 0) {
    if (((VP8CPUInfo)InitGammaTablesS_InitGammaTablesS_body_last_cpuinfo_used != VP8GetCPUInfo) &&
       (kGammaTablesSOk == 0)) {
      puVar41 = kGammaToLinearTabS;
      for (lVar45 = 0; lVar45 != 0x400; lVar45 = lVar45 + 1) {
        dVar51 = (double)(int)lVar45 * 0.0009775171065493646;
        if (dVar51 <= 0.08124285829863151) {
          dVar51 = dVar51 / 4.5;
        }
        else {
          dVar51 = pow((dVar51 + 0.09929682680944) * 0.909672415686275,2.2222222222222223);
        }
        *puVar41 = (uint32_t)(long)(dVar51 * 16384.0 + 0.5);
        puVar41 = puVar41 + 1;
      }
      puVar41 = kLinearToGammaTabS;
      for (lVar45 = 0; lVar45 != 0x21; lVar45 = lVar45 + 1) {
        dVar51 = (double)(int)lVar45 * 0.03125;
        if (dVar51 <= 0.018053968510807) {
          dVar51 = dVar51 * 4.5;
        }
        else {
          dVar51 = pow(dVar51,0.44999999999999996);
          dVar51 = dVar51 * 1.09929682680944 + -0.09929682680944;
        }
        *puVar41 = (int)(long)(dVar51 * 1023.0) + 0x2000;
        puVar41 = puVar41 + 1;
      }
      kLinearToGammaTabS[0x21] = kLinearToGammaTabS[0x20];
      kGammaTablesSOk = 1;
    }
    InitGammaTablesS_InitGammaTablesS_body_last_cpuinfo_used = VP8GetCPUInfo;
    pthread_mutex_unlock((pthread_mutex_t *)InitGammaTablesS_InitGammaTablesS_body_lock);
  }
  uVar38 = (long)picture->width + 1;
  uVar25 = uVar38 & 0xfffffffffffffffe;
  uVar46 = (long)picture->height + 1;
  uVar21 = uVar46 & 0xfffffffffffffffe;
  iVar37 = (int)uVar38 >> 1;
  iVar33 = (int)uVar25;
  src_00 = (fixed_y_t *)WebPSafeMalloc((long)(iVar33 * 6),2);
  uVar42 = uVar25 * uVar21;
  puVar13 = (uint16_t *)WebPSafeMalloc(uVar42,2);
  puVar14 = (uint16_t *)WebPSafeMalloc(uVar42,2);
  uVar42 = (uint64_t)(iVar33 * 2);
  dst = (fixed_y_t *)WebPSafeMalloc(uVar42,2);
  iVar7 = iVar37 * 3;
  uVar43 = (uint64_t)(((int)uVar46 >> 1) * iVar7);
  ptr = (int16_t *)WebPSafeMalloc(uVar43,2);
  ptr_00 = (int16_t *)WebPSafeMalloc(uVar43,2);
  uVar43 = (uint64_t)iVar7;
  dst_00 = (fixed_t *)WebPSafeMalloc(uVar43,2);
  auVar52._0_4_ = -(uint)((int)((ulong)puVar13 >> 0x20) == 0 && (int)puVar13 == 0);
  auVar52._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
  auVar52._8_4_ = -(uint)((int)((ulong)puVar14 >> 0x20) == 0 && (int)puVar14 == 0);
  auVar52._12_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
  iVar8 = movmskps((int)dst_00,auVar52);
  if ((((iVar8 == 0) && (dst != (fixed_y_t *)0x0)) && (dst_00 != (fixed_t *)0x0)) &&
     (src_00 != (fixed_y_t *)0x0)) {
    local_1d0 = (int)uVar21;
    dVar51 = (double)local_1d0 * (double)iVar33 * 3.0;
    uVar21 = (ulong)dVar51;
    WebPInitConvertARGBToYUV();
    src = src_00 + iVar33 * 3;
    __n = (long)(iVar33 * 3) * 2;
    lVar45 = (long)iVar33;
    lVar47 = 0;
    lVar40 = 0;
    lVar39 = 0;
    for (iVar8 = 0; iVar12 = picture->height, iVar8 < iVar12; iVar8 = iVar8 + 2) {
      ImportOneRow(r_ptr + lVar47,g_ptr + lVar47,b_ptr + lVar47,step,picture->width,src_00);
      if (iVar8 == iVar12 + -1) {
        memcpy(src,src_00,__n);
      }
      else {
        ImportOneRow(r_ptr + lVar47 + rgb_stride,g_ptr + lVar47 + rgb_stride,
                     b_ptr + lVar47 + rgb_stride,step,picture->width,src);
      }
      StoreGray(src_00,(fixed_y_t *)((long)puVar13 + lVar39),iVar33);
      StoreGray(src,(fixed_y_t *)((long)puVar13 + lVar39 + lVar45 * 2),iVar33);
      UpdateW(src_00,(fixed_y_t *)((long)puVar14 + lVar39),iVar33);
      UpdateW(src,(fixed_y_t *)((long)puVar14 + lVar39 + lVar45 * 2),iVar33);
      UpdateChroma(src_00,src,(fixed_t *)((long)ptr_00 + lVar40),iVar37);
      memcpy((void *)((long)ptr + lVar40),(fixed_t *)((long)ptr_00 + lVar40),uVar43 * 2);
      lVar39 = lVar39 + uVar42 * 2;
      lVar40 = lVar40 + uVar43 * 2;
      lVar47 = lVar47 + rgb_stride * 2;
    }
    iVar8 = iVar33 + -1 >> 1;
    lVar39 = (long)iVar37 * 2 + -2;
    lVar40 = lVar45 * 2;
    local_1a0 = 0xffffffffffffffff;
    for (iVar12 = 0; iVar12 != 4; iVar12 = iVar12 + 1) {
      local_180 = 0;
      puVar23 = puVar14;
      local_2b8 = puVar13;
      local_2a0 = ptr;
      local_250 = ptr;
      local_178 = ptr_00;
      local_170 = ptr;
      for (iVar17 = 0; iVar17 < local_1d0; iVar17 = iVar17 + 2) {
        iVar9 = 0;
        if (iVar17 < local_1d0 + -2) {
          iVar9 = iVar7;
        }
        lVar22 = 0;
        lVar20 = 0;
        lVar47 = __n + 2 + (long)(iVar33 + -2) * 2;
        lVar27 = (long)(iVar33 + -2) * 2 + 2;
        sVar48 = __n;
        for (iVar11 = -3; iVar11 != 0; iVar11 = iVar11 + 1) {
          piVar34 = (int16_t *)((long)local_2a0 + lVar20);
          iVar10 = (*piVar34 * 3 + (int)*(int16_t *)((long)local_250 + lVar20) + 2 >> 2) +
                   (uint)*local_2b8;
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          piVar35 = (int16_t *)((long)(local_2a0 + iVar9) + lVar20);
          uVar5 = (undefined2)iVar10;
          if (0x3fe < iVar10) {
            uVar5 = 0x3ff;
          }
          *(undefined2 *)((long)src_00 + lVar22) = uVar5;
          iVar10 = (*piVar34 * 3 + (int)*piVar35 + 2 >> 2) + (uint)local_2b8[lVar45];
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar5 = (undefined2)iVar10;
          if (0x3fe < iVar10) {
            uVar5 = 0x3ff;
          }
          *(undefined2 *)((long)src_00 + sVar48) = uVar5;
          (*WebPSharpYUVFilterRow)
                    (piVar34,(int16_t *)((long)local_250 + lVar20),iVar8,local_2b8 + 1,
                     (uint16_t *)((long)src_00 + lVar22 + 2));
          (*WebPSharpYUVFilterRow)
                    (piVar34,piVar35,iVar8,local_2b8 + lVar45 + 1,
                     (uint16_t *)((long)src_00 + sVar48 + 2));
          iVar10 = (*(short *)((long)local_250 + lVar20 + lVar39) + 2 +
                    *(short *)((long)local_2a0 + lVar20 + lVar39) * 3 >> 2) +
                   (uint)local_2b8[iVar33 + -1];
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar5 = (undefined2)iVar10;
          if (0x3fe < iVar10) {
            uVar5 = 0x3ff;
          }
          *(undefined2 *)((long)src_00 + lVar27) = uVar5;
          iVar10 = (*(short *)((long)local_2a0 + lVar20 + lVar39) * 3 +
                    (int)*(short *)((long)local_2a0 + lVar20 + (long)iVar9 * 2 + lVar39) + 2 >> 2) +
                   (uint)local_2b8[iVar33 * 2 + -1];
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar5 = (undefined2)iVar10;
          if (0x3fe < iVar10) {
            uVar5 = 0x3ff;
          }
          *(undefined2 *)((long)src_00 + lVar47) = uVar5;
          lVar20 = lVar20 + (long)iVar37 * 2;
          lVar27 = lVar27 + lVar40;
          lVar22 = lVar22 + lVar40;
          lVar47 = lVar47 + lVar40;
          sVar48 = sVar48 + lVar40;
        }
        UpdateW(src_00,dst,iVar33);
        UpdateW(src,dst + lVar45,iVar33);
        UpdateChroma(src_00,src,dst_00,iVar37);
        uVar15 = (*WebPSharpYUVUpdateY)(puVar23,dst,local_2b8,iVar33 * 2);
        local_180 = local_180 + uVar15;
        (*WebPSharpYUVUpdateRGB)(local_178,dst_00,local_170,iVar7);
        local_2b8 = local_2b8 + uVar42;
        local_170 = local_170 + uVar43;
        puVar23 = puVar23 + uVar42;
        local_178 = local_178 + uVar43;
        local_250 = local_2a0;
        local_2a0 = local_2a0 + iVar9;
      }
      if ((iVar12 != 0) &&
         ((local_180 < ((long)(dVar51 - 9.223372036854776e+18) & (long)uVar21 >> 0x3f | uVar21) ||
          (local_1a0 < local_180)))) break;
      local_1a0 = local_180;
    }
    puVar28 = picture->y;
    puVar16 = picture->u;
    puVar18 = picture->v;
    iVar7 = picture->width;
    iVar8 = picture->height;
    uVar31 = iVar7 + 1U & 0xfffffffe;
    uVar29 = (int)(iVar7 + 1U) >> 1;
    puVar23 = puVar13;
    piVar34 = ptr;
    iVar33 = iVar8;
    for (uVar36 = 0; (int)uVar36 < iVar33; uVar36 = uVar36 + 1) {
      for (lVar45 = 0; lVar45 < iVar7; lVar45 = lVar45 + 1) {
        uVar44 = (uint)lVar45 >> 1;
        iVar33 = (int)(piVar34[(int)(uVar44 + uVar29)] * 0x8123 + (uint)puVar23[lVar45] * 0xc2ea +
                       *(short *)((long)piVar34 + (ulong)((uint)lVar45 & 0xfffffffe)) * 0x41c7 +
                       ((int)piVar34[(int)(uVar44 + uVar31)] + (uint)puVar23[lVar45]) * 0x1914 +
                      0x20000) >> 0x12;
        iVar7 = iVar33 + 0x10;
        uVar32 = -(-0x11 < iVar33);
        if ((ushort)iVar7 < 0x100) {
          uVar32 = (uint8_t)iVar7;
        }
        puVar28[lVar45] = uVar32;
        iVar7 = picture->width;
      }
      piVar34 = piVar34 + (int)((uVar36 & 1) * uVar29 * 3);
      puVar28 = puVar28 + picture->y_stride;
      iVar33 = picture->height;
      puVar23 = puVar23 + (int)uVar31;
    }
    iVar8 = iVar8 + 1 >> 1;
    iVar7 = uVar29 * 3;
    iVar33 = 0;
    uVar21 = 0;
    if (0 < (int)uVar29) {
      uVar21 = (ulong)uVar29;
    }
    if (iVar8 < 1) {
      iVar8 = iVar33;
    }
    piVar34 = ptr + (int)uVar31;
    piVar35 = ptr + (int)uVar29;
    piVar24 = ptr;
    for (; iVar33 != iVar8; iVar33 = iVar33 + 1) {
      for (uVar25 = 0; uVar21 != uVar25; uVar25 = uVar25 + 1) {
        sVar1 = piVar24[uVar25];
        sVar2 = piVar35[uVar25];
        sVar3 = piVar34[uVar25];
        iVar37 = sVar3 * 0x7080 + 0x20000 + sVar2 * -0x4a89 + sVar1 * -0x25f7;
        iVar12 = iVar37 >> 0x12;
        cVar19 = (char)iVar12;
        uVar32 = -(-0x81 < iVar12);
        if ((short)cVar19 == (short)(iVar37 >> 0x12)) {
          uVar32 = cVar19 + 0x80;
        }
        puVar16[uVar25] = uVar32;
        iVar37 = sVar3 * -0x124c + 0x20000 + sVar2 * -0x5e34 + sVar1 * 0x7080;
        iVar12 = iVar37 >> 0x12;
        cVar19 = (char)iVar12;
        uVar32 = -(-0x81 < iVar12);
        if ((short)cVar19 == (short)(iVar37 >> 0x12)) {
          uVar32 = cVar19 + 0x80;
        }
        puVar18[uVar25] = uVar32;
      }
      puVar16 = puVar16 + picture->uv_stride;
      puVar18 = puVar18 + picture->uv_stride;
      piVar34 = piVar34 + iVar7;
      piVar35 = piVar35 + iVar7;
      piVar24 = piVar24 + iVar7;
    }
    WebPSafeFree(puVar13);
    WebPSafeFree(ptr);
    WebPSafeFree(puVar14);
    WebPSafeFree(ptr_00);
    WebPSafeFree(dst);
    WebPSafeFree(dst_00);
    WebPSafeFree(src_00);
    if (iVar6 == 0) {
      return 1;
    }
  }
  else {
    iVar7 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
    WebPSafeFree(puVar13);
    WebPSafeFree(ptr);
    WebPSafeFree(puVar14);
    WebPSafeFree(ptr_00);
    WebPSafeFree(dst);
    WebPSafeFree(dst_00);
    WebPSafeFree(src_00);
    if (iVar7 == 0 || iVar6 == 0) {
      return (uint)(iVar7 != 0);
    }
  }
  (*WebPExtractAlpha)(a_ptr,rgb_stride,width,height,picture->a,picture->a_stride);
  return 1;
}

Assistant:

static int ImportYUVAFromRGBA(const uint8_t* r_ptr,
                              const uint8_t* g_ptr,
                              const uint8_t* b_ptr,
                              const uint8_t* a_ptr,
                              int step,         // bytes per pixel
                              int rgb_stride,   // bytes per scanline
                              float dithering,
                              int use_iterative_conversion,
                              WebPPicture* const picture) {
  int y;
  const int width = picture->width;
  const int height = picture->height;
  const int has_alpha = CheckNonOpaque(a_ptr, width, height, step, rgb_stride);
  const int is_rgb = (r_ptr < b_ptr);  // otherwise it's bgr

  picture->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
  picture->use_argb = 0;

  // disable smart conversion if source is too small (overkill).
  if (width < kMinDimensionIterativeConversion ||
      height < kMinDimensionIterativeConversion) {
    use_iterative_conversion = 0;
  }

  if (!WebPPictureAllocYUVA(picture, width, height)) {
    return 0;
  }
  if (has_alpha) {
    assert(step == 4);
#if defined(USE_GAMMA_COMPRESSION) && defined(USE_INVERSE_ALPHA_TABLE)
    assert(kAlphaFix + kGammaFix <= 31);
#endif
  }

  if (use_iterative_conversion) {
    InitGammaTablesS();
    if (!PreprocessARGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, picture)) {
      return 0;
    }
    if (has_alpha) {
      WebPExtractAlpha(a_ptr, rgb_stride, width, height,
                       picture->a, picture->a_stride);
    }
  } else {
    const int uv_width = (width + 1) >> 1;
    int use_dsp = (step == 3);  // use special function in this case
    // temporary storage for accumulated R/G/B values during conversion to U/V
    uint16_t* const tmp_rgb =
        (uint16_t*)WebPSafeMalloc(4 * uv_width, sizeof(*tmp_rgb));
    uint8_t* dst_y = picture->y;
    uint8_t* dst_u = picture->u;
    uint8_t* dst_v = picture->v;
    uint8_t* dst_a = picture->a;

    VP8Random base_rg;
    VP8Random* rg = NULL;
    if (dithering > 0.) {
      VP8InitRandom(&base_rg, dithering);
      rg = &base_rg;
      use_dsp = 0;   // can't use dsp in this case
    }
    WebPInitConvertARGBToYUV();
    InitGammaTables();

    if (tmp_rgb == NULL) return 0;  // malloc error

    // Downsample Y/U/V planes, two rows at a time
    for (y = 0; y < (height >> 1); ++y) {
      int rows_have_alpha = has_alpha;
      if (use_dsp) {
        if (is_rgb) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
          WebPConvertRGB24ToY(r_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
          WebPConvertBGR24ToY(b_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
        ConvertRowToY(r_ptr + rgb_stride,
                      g_ptr + rgb_stride,
                      b_ptr + rgb_stride, step,
                      dst_y + picture->y_stride, width, rg);
      }
      dst_y += 2 * picture->y_stride;
      if (has_alpha) {
        rows_have_alpha &= !WebPExtractAlpha(a_ptr, rgb_stride, width, 2,
                                             dst_a, picture->a_stride);
        dst_a += 2 * picture->a_stride;
      }
      // Collect averaged R/G/B(/A)
      if (!rows_have_alpha) {
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, rgb_stride, tmp_rgb, width);
      }
      // Convert to U/V
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
      dst_u += picture->uv_stride;
      dst_v += picture->uv_stride;
      r_ptr += 2 * rgb_stride;
      b_ptr += 2 * rgb_stride;
      g_ptr += 2 * rgb_stride;
      if (has_alpha) a_ptr += 2 * rgb_stride;
    }
    if (height & 1) {    // extra last row
      int row_has_alpha = has_alpha;
      if (use_dsp) {
        if (r_ptr < b_ptr) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
      }
      if (row_has_alpha) {
        row_has_alpha &= !WebPExtractAlpha(a_ptr, 0, width, 1, dst_a, 0);
      }
      // Collect averaged R/G/B(/A)
      if (!row_has_alpha) {
        // Collect averaged R/G/B
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, /* rgb_stride = */ 0,
                      tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, /* rgb_stride = */ 0,
                       tmp_rgb, width);
      }
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
    }
    WebPSafeFree(tmp_rgb);
  }
  return 1;
}